

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O2

bool QSystemSemaphore::isKeyTypeSupported(Type type)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined8 uVar3;
  int *piVar4;
  undefined6 in_register_0000003a;
  undefined8 in_R8;
  undefined8 in_R9;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,type);
  if (iVar2 == 0x101) {
    return false;
  }
  if (iVar2 == 0x100) {
    uVar3 = CONCAT71((int7)((ulong)in_RAX >> 8),QSystemSemaphorePosix::runtimeSupportCheck()::result
                    );
    if ((QSystemSemaphorePosix::runtimeSupportCheck()::result == '\0') &&
       (iVar2 = __cxa_guard_acquire(&QSystemSemaphorePosix::runtimeSupportCheck()::result),
       iVar2 != 0)) {
      sem_open("/",0,0,0,in_R8,in_R9,uVar3);
      piVar4 = __errno_location();
      QSystemSemaphorePosix::runtimeSupportCheck::result = *piVar4 != 0x26;
      __cxa_guard_release(&QSystemSemaphorePosix::runtimeSupportCheck()::result);
    }
    return QSystemSemaphorePosix::runtimeSupportCheck::result;
  }
  bVar1 = QSystemSemaphoreSystemV::runtimeSupportCheck();
  return bVar1;
}

Assistant:

bool QSystemSemaphore::isKeyTypeSupported(QNativeIpcKey::Type type)
{
    if (!isIpcSupported(IpcType::SystemSemaphore, type))
        return false;
    using Variant = decltype(QSystemSemaphorePrivate::backend);
    return Variant::staticVisit(type, [](auto ptr) {
        using Impl = std::decay_t<decltype(*ptr)>;
        return Impl::runtimeSupportCheck();
    });
}